

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_str_kv_test.cc
# Opt level: O2

void kv_get_str_kv_size_test(void)

{
  size_t sVar1;
  char *__format;
  int v;
  void *key;
  btree local_e8;
  timeval __test_begin;
  btree_kv_ops local_98;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  btree_str_kv_get_kb64_vb64(&local_98);
  local_e8.vsize = 4;
  v = 1;
  key = malloc(0xd);
  *(undefined2 *)key = 0xb00;
  *(undefined8 *)((long)key + 2) = 0x6972747374736574;
  *(undefined4 *)((long)key + 9) = 0x676e69;
  sVar1 = (*local_98.get_kv_size)(&local_e8,&key,&v);
  if (sVar1 != (ulong)local_e8.vsize + 0xd) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
            ,0x344);
    kv_get_str_kv_size_test()::__test_pass = '\x01';
    if (sVar1 != (ulong)local_e8.vsize + 0xd) {
      __assert_fail("size == (sizeof(str) + sizeof(key_len_t) + tree->vsize)",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                    ,0x344,"void kv_get_str_kv_size_test()");
    }
  }
  sVar1 = (*local_98.get_kv_size)(&local_e8,(void *)0x0,&v);
  if (sVar1 != local_e8.vsize) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
            ,0x348);
    kv_get_str_kv_size_test()::__test_pass = '\x01';
    if (sVar1 != local_e8.vsize) {
      __assert_fail("size == (tree->vsize)",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                    ,0x348,"void kv_get_str_kv_size_test()");
    }
  }
  sVar1 = (*local_98.get_kv_size)(&local_e8,&key,(void *)0x0);
  if (sVar1 == 0xd) {
    sVar1 = (*local_98.get_kv_size)(&local_e8,(void *)0x0,(void *)0x0);
    if (sVar1 == 0) {
      free(key);
      memleak_end();
      __format = "%s PASSED\n";
      if (kv_get_str_kv_size_test()::__test_pass != '\0') {
        __format = "%s FAILED\n";
      }
      fprintf(_stderr,__format,"kv_get_str_kv_size_test");
      return;
    }
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
            ,0x350);
    kv_get_str_kv_size_test()::__test_pass = 1;
    __assert_fail("size == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                  ,0x350,"void kv_get_str_kv_size_test()");
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
          ,0x34c);
  kv_get_str_kv_size_test()::__test_pass = 1;
  __assert_fail("size == (sizeof(str) + sizeof(key_len_t))",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                ,0x34c,"void kv_get_str_kv_size_test()");
}

Assistant:

void kv_get_str_kv_size_test()
{
    TEST_INIT();
    memleak_start();

    btree_kv_ops *kv_ops;
    btree *tree;
    void *key;
    int v;
    size_t size;
    char str[] = "teststring";

    kv_ops = alca(btree_kv_ops, 1);
    btree_str_kv_get_kb64_vb64(kv_ops);
    tree = alca(struct btree, 1);
    tree->vsize = sizeof(v);
    v = 1;
    construct_key_ptr(str, sizeof(str), &key);

    // get/verify size of kv string
    size = kv_ops->get_kv_size(tree, &key, (void *)&v);
    TEST_CHK(size == (sizeof(str) + sizeof(key_len_t) + tree->vsize));

    // verify with NULL key
    size = kv_ops->get_kv_size(tree, NULL, (void *)&v);
    TEST_CHK(size == (tree->vsize));

    // verify with NULL value
    size = kv_ops->get_kv_size(tree, &key, NULL);
    TEST_CHK(size == (sizeof(str) + sizeof(key_len_t)));

    // NULL key/value
    size = kv_ops->get_kv_size(tree, NULL, NULL);
    TEST_CHK(size == 0);

    free(key);
    memleak_end();
    TEST_RESULT("kv_get_str_kv_size_test");
}